

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_do(connectdata *conn,_Bool *done)

{
  anon_union_224_10_26c073a1_for_proto *pp;
  SessionHandle *pSVar1;
  undefined4 *puVar2;
  curl_slist *pcVar3;
  CURLcode CVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  undefined1 connected;
  char *fmt;
  char *pcVar9;
  _Bool *p_Var8;
  
  *done = false;
  pSVar1 = conn->data;
  pcVar6 = (pSVar1->set).str[4];
  if (pcVar6 == (char *)0x0) {
    CVar4 = CURLE_OK;
  }
  else {
    CVar4 = Curl_urldecode(pSVar1,pcVar6,0,(char **)((long)(pSVar1->req).protop + 8),(size_t *)0x0,
                           true);
  }
  if (CVar4 != CURLE_OK) {
    return CVar4;
  }
  pSVar1 = conn->data;
  (pSVar1->req).size = -1;
  Curl_pgrsSetUploadCounter(pSVar1,0);
  Curl_pgrsSetDownloadCounter(pSVar1,0);
  Curl_pgrsSetUploadSize(pSVar1,-1);
  connected = 0xff;
  Curl_pgrsSetDownloadSize(pSVar1,-1);
  pSVar1 = conn->data;
  puVar2 = (undefined4 *)(pSVar1->req).protop;
  if ((pSVar1->set).opt_no_body == true) {
    *puVar2 = 1;
  }
  *done = false;
  pcVar3 = (pSVar1->set).mail_rcpt;
  *(curl_slist **)(puVar2 + 4) = pcVar3;
  if ((pcVar3 != (curl_slist *)0x0 & (pSVar1->set).upload) != 1) {
    CVar4 = smtp_perform_command(conn);
    goto LAB_00582118;
  }
  pcVar6 = (pSVar1->set).str[0x25];
  if (pcVar6 == (char *)0x0) {
    pcVar9 = (*Curl_cstrdup)("<>");
    connected = SUB81(pcVar6,0);
  }
  else {
    if (*pcVar6 == '<') {
      pcVar9 = "%s";
    }
    else {
      pcVar9 = "<%s>";
    }
    pcVar9 = curl_maprintf(pcVar9);
    connected = SUB81(pcVar6,0);
  }
  CVar4 = CURLE_OUT_OF_MEMORY;
  if (pcVar9 == (char *)0x0) goto LAB_00582118;
  pcVar6 = (pSVar1->set).str[0x26];
  if ((pcVar6 == (char *)0x0) || (*(int *)((long)&conn->proto + 0x94) == 0)) {
    pcVar5 = (char *)0x0;
  }
  else {
    if (*pcVar6 == '\0') {
      pcVar5 = (*Curl_cstrdup)("<>");
      connected = SUB81(pcVar6,0);
    }
    else {
      pcVar5 = curl_maprintf("%s");
      connected = SUB81(pcVar6,0);
    }
    if (pcVar5 == (char *)0x0) {
      (*Curl_cfree)(pcVar9);
      goto LAB_00582118;
    }
  }
  if (((conn->proto).imapc.resptag[1] == '\x01') && (0 < (conn->data->state).infilesize)) {
    connected = (undefined1)(pSVar1->state).infilesize;
    pcVar6 = curl_maprintf("%ld");
    if (pcVar6 == (char *)0x0) {
      (*Curl_cfree)(pcVar9);
      (*Curl_cfree)(pcVar5);
      goto LAB_00582118;
    }
  }
  else {
    pcVar6 = (char *)0x0;
  }
  pp = &conn->proto;
  if (pcVar5 == (char *)0x0 && pcVar6 == (char *)0x0) {
    connected = 0xd9;
    CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,"MAIL FROM:%s",pcVar9);
  }
  else {
    if ((pcVar5 == (char *)0x0) || (pcVar6 != (char *)0x0)) {
      if ((pcVar5 != (char *)0x0) && (pcVar6 != (char *)0x0)) {
        connected = 0xfb;
        CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,"MAIL FROM:%s AUTH=%s SIZE=%s",pcVar9,pcVar5,pcVar6);
        goto LAB_005820e9;
      }
      fmt = "MAIL FROM:%s SIZE=%s";
      pcVar7 = pcVar6;
    }
    else {
      fmt = "MAIL FROM:%s AUTH=%s";
      pcVar7 = pcVar5;
    }
    CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,fmt,pcVar9,pcVar7);
    connected = SUB81(fmt,0);
  }
LAB_005820e9:
  (*Curl_cfree)(pcVar9);
  (*Curl_cfree)(pcVar5);
  (*Curl_cfree)(pcVar6);
  if (CVar4 == CURLE_OK) {
    (conn->proto).imapc.state = IMAP_SELECT;
  }
LAB_00582118:
  if (CVar4 == CURLE_OK) {
    p_Var8 = done;
    CVar4 = smtp_multi_statemach(conn,done);
    connected = SUB81(p_Var8,0);
  }
  if ((CVar4 == CURLE_OK) && (CVar4 = CURLE_OK, *done == true)) {
    smtp_dophase_done(conn,(_Bool)connected);
  }
  return CVar4;
}

Assistant:

static CURLcode smtp_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the custom request */
  result = smtp_parse_custom_request(conn);
  if(result)
    return result;

  result = smtp_regular_transfer(conn, done);

  return result;
}